

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pam.c
# Opt level: O3

pam_t * pam_copy(pam_t *pam)

{
  int iVar1;
  int iVar2;
  int iVar3;
  pam_t *ppVar4;
  uint8_t *__dest;
  
  ppVar4 = (pam_t *)calloc(1,0x20);
  ppVar4->maxval = pam->maxval;
  iVar1 = pam->width;
  iVar2 = pam->height;
  iVar3 = pam->depth;
  ppVar4->type = pam->type;
  ppVar4->width = iVar1;
  ppVar4->height = iVar2;
  ppVar4->depth = iVar3;
  iVar1 = pam->datalen;
  ppVar4->datalen = iVar1;
  __dest = (uint8_t *)malloc((long)iVar1);
  ppVar4->data = __dest;
  memcpy(__dest,pam->data,(long)iVar1);
  return ppVar4;
}

Assistant:

pam_t *pam_copy(pam_t *pam)
{
    pam_t *copy = calloc(1, sizeof(pam_t));
    copy->width = pam->width;
    copy->height = pam->height;
    copy->depth = pam->depth;
    copy->maxval = pam->maxval;
    copy->type = pam->type;

    copy->datalen = pam->datalen;
    copy->data = malloc(pam->datalen);
    memcpy(copy->data, pam->data, pam->datalen);

    return copy;
}